

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlmembuf.c
# Opt level: O0

int ixml_membuf_insert(ixml_membuf *m,void *buf,size_t buf_len,size_t index)

{
  int return_code;
  size_t index_local;
  size_t buf_len_local;
  void *buf_local;
  ixml_membuf *m_local;
  
  if (m == (ixml_membuf *)0x0) {
    __assert_fail("m != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlmembuf.c"
                  ,0xbb,"int ixml_membuf_insert(ixml_membuf *, const void *, size_t, size_t)");
  }
  if (m->length < index) {
    m_local._4_4_ = 1;
  }
  else if ((buf == (void *)0x0) || (buf_len == 0)) {
    m_local._4_4_ = 0;
  }
  else {
    m_local._4_4_ = ixml_membuf_set_size(m,m->length + buf_len);
    if (m_local._4_4_ == 0) {
      memmove(m->buf + buf_len + index,m->buf + index,m->length - index);
      memcpy(m->buf + index,buf,buf_len);
      m->length = buf_len + m->length;
      m->buf[m->length] = '\0';
      m_local._4_4_ = 0;
    }
  }
  return m_local._4_4_;
}

Assistant:

int ixml_membuf_insert(
	/*! [in,out] The memory buffer */
	ixml_membuf *m,
	/*! [in] The buffer to insert */
	const void *buf,
	/*! [in] The length of the buffer */
	size_t buf_len,
	/*! [in] Position where to insert the buffer */
	size_t index)
{
	int return_code = 0;

	assert(m != NULL);

	if (index > m->length) {
		return IXML_INDEX_SIZE_ERR;
	}

	if (buf == NULL || buf_len == (size_t)0) {
		return 0;
	}
	/* alloc mem */
	return_code = ixml_membuf_set_size(m, m->length + buf_len);
	if (return_code != 0) {
		return return_code;
	}
	/* insert data */
	/* move data to right of insertion point */
	memmove(m->buf + index + buf_len, m->buf + index, m->length - index);
	memcpy(m->buf + index, buf, buf_len);
	m->length += buf_len;
	/* Null terminate */
	m->buf[m->length] = 0;

	return 0;
}